

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c3861::AltRefFramePresenceTestLarge_AltRefFrameEncodePresenceTest_Test::TestBody
          (AltRefFramePresenceTestLarge_AltRefFrameEncodePresenceTest_Test *this)

{
  EncoderTest *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertHelper local_a8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_80;
  I420VideoSource video;
  
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,
             (this->super_AltRefFramePresenceTestLarge).super_EncoderTest.cfg_.g_timebase.den,
             (this->super_AltRefFramePresenceTestLarge).super_EncoderTest.cfg_.g_timebase.num,0,100)
  ;
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01044d00;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_AltRefFramePresenceTestLarge).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      local_a8.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_fatal_failure_checker,"is_arf_frame_present_","1",
                 &(this->super_AltRefFramePresenceTestLarge).is_arf_frame_present_,(int *)&local_a8)
      ;
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/altref_test.cc"
                   ,0x6d,(char *)message);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
        }
      }
      puVar2 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      goto LAB_004b1d28;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/altref_test.cc"
             ,0x6c,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_004b1d28:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(AltRefFramePresenceTestLarge, AltRefFrameEncodePresenceTest) {
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 100);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  ASSERT_EQ(is_arf_frame_present_, 1);
}